

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_suite.cpp
# Opt level: O0

void compact_suite::fail_int16_overflow(void)

{
  size_type sVar1;
  pointer output;
  size_type output_length;
  UI_STRING *uis;
  char *ui;
  error *ex;
  array<short,_1UL> buffer;
  undefined1 local_88 [8];
  reader reader;
  value_type input [8];
  
  reader.stack.c.
  super__Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x430042004106aa;
  trial::protocol::bintoken::reader::reader<unsigned_char[8]>
            ((reader *)local_88,
             (uchar (*) [8])
             ((long)&reader.stack.c.
                     super__Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
                     ._M_impl.super__Deque_impl_data._M_finish + 0x18));
  sVar1 = trial::protocol::bintoken::reader::length((reader *)local_88);
  boost::detail::test_impl
            ("reader.length() == 3",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x3d8,"void compact_suite::fail_int16_overflow()",sVar1 == 3);
  ex._2_2_ = 0;
  output = std::array<short,_1UL>::data((array<short,_1UL> *)((long)&ex + 2));
  output_length = std::array<short,_1UL>::size((array<short,_1UL> *)((long)&ex + 2));
  trial::protocol::bintoken::reader::array<short>((reader *)local_88,output,output_length);
  ui = "format::error";
  trial::protocol::core::detail::throw_failed_impl
            ("reader.array<std::int16_t>(buffer.data(), buffer.size())","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x3db,"void compact_suite::fail_int16_overflow()");
  trial::protocol::bintoken::reader::~reader((reader *)local_88,(UI *)ui,uis);
  return;
}

Assistant:

void fail_int16_overflow()
{
    const value_type input[] = {
        token::code::array8_int16, 3 * token::int16::size,
        0x41, 0x00,
        0x42, 0x00,
        0x43, 0x00 };
    format::reader reader(input);
    TRIAL_PROTOCOL_TEST(reader.length() == 3);
    std::array<std::int16_t, 1> buffer = {};
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.array<std::int16_t>(buffer.data(), buffer.size()),
                                    format::error, "overflow");
}